

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void upb_Arena_Free(upb_Arena *a)

{
  _Bool _Var1;
  uintptr_t uVar2;
  uintptr_t uVar3;
  bool bVar4;
  uintptr_t local_20;
  uintptr_t poc;
  upb_ArenaInternal *ai;
  upb_Arena *a_local;
  
  poc = (uintptr_t)upb_Arena_Internal(a);
  local_20 = ((upb_ArenaInternal *)poc)->parent_or_count;
  do {
    while (_Var1 = _upb_Arena_IsTaggedPointer(local_20), _Var1) {
      poc = (uintptr_t)_upb_Arena_PointerFromTagged(local_20);
      local_20 = ((upb_ArenaInternal *)poc)->parent_or_count;
    }
    uVar2 = _upb_Arena_TaggedFromRefcount(1);
    if (local_20 == uVar2) {
      _upb_Arena_DoFree((upb_ArenaInternal *)poc);
      return;
    }
    uVar2 = _upb_Arena_RefCountFromTagged(local_20);
    uVar3 = _upb_Arena_TaggedFromRefcount(uVar2 - 1);
    LOCK();
    uVar2 = *(uintptr_t *)(poc + 0x10);
    bVar4 = local_20 == uVar2;
    if (bVar4) {
      *(uintptr_t *)(poc + 0x10) = uVar3;
      uVar2 = local_20;
    }
    UNLOCK();
    local_20 = uVar2;
  } while (!bVar4);
  return;
}

Assistant:

void upb_Arena_Free(upb_Arena* a) {
  upb_ArenaInternal* ai = upb_Arena_Internal(a);
  // Cannot be replaced with _upb_Arena_FindRoot, as that provides only a
  // relaxed read of the refcount if ai is already the root.
  uintptr_t poc = upb_Atomic_Load(&ai->parent_or_count, memory_order_acquire);
retry:
  while (_upb_Arena_IsTaggedPointer(poc)) {
    ai = _upb_Arena_PointerFromTagged(poc);
    UPB_TSAN_CHECK_PUBLISHED(ai);
    poc = upb_Atomic_Load(&ai->parent_or_count, memory_order_acquire);
  }

  // compare_exchange or fetch_sub are RMW operations, which are more
  // expensive then direct loads.  As an optimization, we only do RMW ops
  // when we need to update things for other threads to see.
  if (poc == _upb_Arena_TaggedFromRefcount(1)) {
#ifdef UPB_TRACING_ENABLED
    upb_Arena_LogFree(a);
#endif
    _upb_Arena_DoFree(ai);
    return;
  }

  if (upb_Atomic_CompareExchangeWeak(
          &ai->parent_or_count, &poc,
          _upb_Arena_TaggedFromRefcount(_upb_Arena_RefCountFromTagged(poc) - 1),
          memory_order_release, memory_order_acquire)) {
    // We were >1 and we decremented it successfully, so we are done.
    return;
  }

  // We failed our update, so someone has done something, retry the whole
  // process, but the failed exchange reloaded `poc` for us.
  goto retry;
}